

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

void __thiscall Market::display(Market *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  pointer ppVar4;
  _Self local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_double,_Order>_> local_20;
  const_iterator iAsk;
  const_iterator iBid;
  Market *this_local;
  
  std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::_Rb_tree_const_iterator(&iAsk);
  std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::_Rb_tree_const_iterator(&local_20);
  poVar2 = std::operator<<((ostream *)&std::cout,"BIDS:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_28 = (_Base_ptr)
             std::
             multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
             ::begin(&this->m_bidOrders);
  iAsk._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
         ::end(&this->m_bidOrders);
    bVar1 = std::operator!=(&iAsk,&local_30);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::operator->(&iAsk);
    poVar2 = operator<<((ostream *)&std::cout,&ppVar4->second);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::operator++(&iAsk);
  }
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ASKS:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_38 = (_Base_ptr)
             std::
             multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
             ::begin(&this->m_askOrders);
  local_20._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
         ::end(&this->m_askOrders);
    bVar1 = std::operator!=(&local_20,&local_40);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::operator->(&local_20);
    poVar2 = operator<<((ostream *)&std::cout,&ppVar4->second);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<std::pair<const_double,_Order>_>::operator++(&local_20);
  }
  return;
}

Assistant:

void Market::display() const
{
  BidOrders::const_iterator iBid;
  AskOrders::const_iterator iAsk;

  std::cout << "BIDS:" << std::endl;
  std::cout << "-----" << std::endl << std::endl;
  for ( iBid = m_bidOrders.begin(); iBid != m_bidOrders.end(); ++iBid )
    std::cout << iBid->second << std::endl;

  std::cout << std::endl << std::endl;

  std::cout << "ASKS:" << std::endl;
  std::cout << "-----" << std::endl << std::endl;
  for ( iAsk = m_askOrders.begin(); iAsk != m_askOrders.end(); ++iAsk )
    std::cout << iAsk->second << std::endl;
}